

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom.c
# Opt level: O0

int igsc_image_oprom_supported_devices_typed
              (igsc_oprom_image *img,uint32_t request_type,igsc_oprom_device_info_4ids *device,
              uint32_t *count)

{
  long lVar1;
  igsc_oprom_type iVar2;
  uint uVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  long in_FS_OFFSET;
  bool bVar6;
  igsc_log_func_t igsc_log_func_3;
  igsc_log_func_t igsc_log_func_2;
  igsc_log_func_t igsc_log_func_1;
  igsc_log_func_t igsc_log_func;
  uint local_3c8;
  igsc_oprom_type img_type;
  uint32_t pos;
  int ret;
  uint32_t *count_local;
  igsc_oprom_device_info_4ids *device_local;
  uint32_t request_type_local;
  igsc_oprom_image *img_local;
  char local_398 [8];
  char __time_buf_6 [128];
  char __time_buf_5 [128];
  char __time_buf_4 [128];
  char __time_buf_3 [128];
  char __time_buf_2 [128];
  char __time_buf_1 [128];
  char __time_buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c8 = 0;
  if ((((img == (igsc_oprom_image *)0x0) || (device == (igsc_oprom_device_info_4ids *)0x0)) ||
      (count == (uint32_t *)0x0)) || (*count == 0)) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(__time_buf_1 + 0x78,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) bad parameters\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
             "igsc_image_oprom_supported_devices_typed",0x110);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(__time_buf_2 + 0x78,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) bad parameters\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                "igsc_image_oprom_supported_devices_typed",0x110);
    }
    img_local._4_4_ = IGSC_OPROM_CODE|IGSC_OPROM_DATA;
  }
  else if ((request_type == 1) || (request_type == 2)) {
    iVar2 = image_oprom_get_type(img);
    if ((iVar2 & request_type) == IGSC_OPROM_NONE) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(__time_buf_5 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) request type %u does not match image type %u \n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
               "igsc_image_oprom_supported_devices_typed",0x11c,request_type,iVar2);
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(__time_buf_6 + 0x78,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                  "%s: IGSC: (%s:%s():%d) request type %u does not match image type %u \n",pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                  "igsc_image_oprom_supported_devices_typed",0x11c,request_type,iVar2);
      }
      img_local._4_4_ = 9;
    }
    else {
      uVar3 = igsc_get_log_level();
      if (uVar3 != 0) {
        p_Var4 = igsc_get_log_callback_func();
        if (p_Var4 == (igsc_log_func_t)0x0) {
          pcVar5 = gsc_time(local_398,0x80);
          syslog(7,"%s: IGSC: (%s:%s():%d) img_type %u, request_type = %u\n",pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                 "igsc_image_oprom_supported_devices_typed",0x120,iVar2,request_type);
        }
        else {
          p_Var4 = igsc_get_log_callback_func();
          pcVar5 = gsc_time(local_398,0x80);
          (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) img_type %u, request_type = %u\n",
                    pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                    "igsc_image_oprom_supported_devices_typed",0x120,iVar2,request_type);
        }
      }
      do {
        uVar3 = local_3c8 + 1;
        img_type = image_oprom_get_next_4ids(img,request_type,device + local_3c8);
        bVar6 = false;
        if (img_type == IGSC_OPROM_NONE) {
          bVar6 = uVar3 < *count;
        }
        local_3c8 = uVar3;
      } while (bVar6);
      if (img_type == 4) {
        img_type = IGSC_OPROM_NONE;
      }
      *count = uVar3;
      img_local._4_4_ = img_type;
    }
  }
  else {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(__time_buf_3 + 0x78,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) request_type %u is not supported\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
             "igsc_image_oprom_supported_devices_typed",0x115,request_type);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(__time_buf_4 + 0x78,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) request_type %u is not supported\n",
                pcVar5,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom.c",
                "igsc_image_oprom_supported_devices_typed",0x115,request_type);
    }
    img_local._4_4_ = IGSC_OPROM_CODE|IGSC_OPROM_DATA;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return img_local._4_4_;
}

Assistant:

int igsc_image_oprom_supported_devices_typed(IN struct igsc_oprom_image *img,
                                             IN uint32_t request_type,
                                             OUT struct igsc_oprom_device_info_4ids *device,
                                             IN OUT uint32_t *count)
{
    int ret;
    uint32_t pos = 0;
    enum igsc_oprom_type img_type;

    if (img == NULL || device == NULL || count == NULL || *count == 0)
    {
        gsc_error("bad parameters\n");
        return IGSC_ERROR_INVALID_PARAMETER;
    }
    if (request_type != IGSC_OPROM_DATA && request_type != IGSC_OPROM_CODE)
    {
        gsc_error("request_type %u is not supported\n", request_type);
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    img_type = image_oprom_get_type(img);
    if ((img_type & request_type) == 0)
    {
        gsc_error("request type %u does not match image type %u \n", request_type, img_type);
        return IGSC_ERROR_NOT_SUPPORTED;
    }

    gsc_debug("img_type %u, request_type = %u\n", img_type, request_type);

    do
    {
        ret = image_oprom_get_next_4ids(img, request_type, &device[pos++]);
    }
    while (ret == IGSC_SUCCESS && pos < *count);

    if (ret == IGSC_ERROR_DEVICE_NOT_FOUND)
    {
        ret = IGSC_SUCCESS;
    }
    *count = pos;

    return ret;
}